

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

QRegion __thiscall QWidgetPrivate::clipRegion(QWidgetPrivate *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QWidget *pQVar5;
  const_reference ppQVar6;
  QWidget *this_00;
  QWidgetPrivate *pQVar7;
  qsizetype qVar8;
  QWidget *pQVar9;
  QWidgetPrivate *in_RSI;
  QRegionData *in_RDI;
  long in_FS_OFFSET;
  QWidget *sibling;
  int i;
  int oy;
  int ox;
  QWidget *ignoreUpTo;
  QWidget *w;
  QWidget *q;
  QRegion *r;
  QRect siblingRect;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  QWidget *in_stack_ffffffffffffff48;
  int local_84;
  int local_80;
  int local_7c;
  QWidget *local_70;
  QRegion local_48;
  QRect local_40;
  undefined1 *local_30;
  undefined1 *local_28;
  QRegion local_20;
  QRect local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_70 = q_func(in_RSI);
  bVar1 = QWidget::isVisible((QWidget *)0x3657f5);
  if (bVar1) {
    *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = QWidget::rect(in_stack_ffffffffffffff48);
    QRegion::QRegion((QRegion *)in_RDI,(QRect *)&local_18,Rectangle);
    local_7c = 0;
    local_80 = 0;
    while( true ) {
      bVar1 = false;
      if (local_70 != (QWidget *)0x0) {
        bVar2 = QWidget::isVisible((QWidget *)0x36588b);
        bVar1 = false;
        if (bVar2) {
          bVar2 = QWidget::isWindow((QWidget *)
                                    CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
          bVar1 = false;
          if (!bVar2) {
            pQVar5 = QWidget::parentWidget((QWidget *)0x3658bb);
            bVar1 = pQVar5 != (QWidget *)0x0;
          }
        }
      }
      if (!bVar1) break;
      iVar3 = QWidget::x((QWidget *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      local_7c = local_7c - iVar3;
      iVar3 = QWidget::y((QWidget *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      local_80 = local_80 - iVar3;
      pQVar5 = QWidget::parentWidget((QWidget *)0x365913);
      iVar3 = QWidget::width((QWidget *)0x365932);
      iVar4 = QWidget::height((QWidget *)0x365940);
      QRegion::QRegion(&local_20,local_7c,local_80,iVar3,iVar4,Rectangle);
      QRegion::operator&=((QRegion *)in_RDI,(QRegion *)&local_20);
      QRegion::~QRegion(&local_20);
      local_84 = 0;
      do {
        QWidget::d_func((QWidget *)0x365990);
        local_84 = local_84 + 1;
        ppQVar6 = QList<QObject_*>::at
                            ((QList<QObject_*> *)
                             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      } while ((QWidget *)*ppQVar6 != local_70);
      while( true ) {
        this_00 = (QWidget *)(long)local_84;
        pQVar7 = QWidget::d_func((QWidget *)0x3659ce);
        qVar8 = QList<QObject_*>::size((QList<QObject_*> *)&pQVar7->field_0x18);
        local_70 = pQVar5;
        if (qVar8 <= (long)this_00) break;
        QWidget::d_func((QWidget *)0x3659f5);
        QList<QObject_*>::at
                  ((QList<QObject_*> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                   ,CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        pQVar9 = qobject_cast<QWidget*>
                           ((QObject *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
                           );
        if (((pQVar9 != (QWidget *)0x0) && (bVar1 = QWidget::isVisible((QWidget *)0x365a29), bVar1))
           && (bVar1 = QWidget::isWindow((QWidget *)
                                         CONCAT44(in_stack_ffffffffffffff34,
                                                  in_stack_ffffffffffffff30)), !bVar1)) {
          local_30 = &DAT_aaaaaaaaaaaaaaaa;
          local_28 = &DAT_aaaaaaaaaaaaaaaa;
          in_stack_ffffffffffffff34 = local_7c;
          iVar4 = QWidget::x((QWidget *)
                             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
          iVar4 = in_stack_ffffffffffffff34 + iVar4;
          iVar3 = local_80;
          in_stack_ffffffffffffff40 =
               QWidget::y((QWidget *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
          in_stack_ffffffffffffff40 = iVar3 + in_stack_ffffffffffffff40;
          in_stack_ffffffffffffff44 = QWidget::width((QWidget *)0x365aa8);
          QWidget::height((QWidget *)0x365ab6);
          QRect::QRect((QRect *)CONCAT44(iVar4,iVar3),in_stack_ffffffffffffff34,
                       in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28
                      );
          local_40 = QWidget::rect(this_00);
          bVar1 = qRectIntersects((QRect *)CONCAT44(iVar4,iVar3),
                                  (QRect *)CONCAT44(in_stack_ffffffffffffff34,
                                                    in_stack_ffffffffffffff30));
          if (bVar1) {
            QRegion::QRegion(&local_48,(QRect *)&local_30,Rectangle);
            QRegion::operator-=((QRegion *)in_RDI,(QRegion *)&local_48);
            QRegion::~QRegion(&local_48);
          }
        }
        local_84 = local_84 + 1;
      }
    }
  }
  else {
    QRegion::QRegion((QRegion *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QRegion)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QRegion QWidgetPrivate::clipRegion() const
{
    Q_Q(const QWidget);
    if (!q->isVisible())
        return QRegion();
    QRegion r(q->rect());
    const QWidget * w = q;
    const QWidget *ignoreUpTo;
    int ox = 0;
    int oy = 0;
    while (w
           && w->isVisible()
           && !w->isWindow()
           && w->parentWidget()) {
        ox -= w->x();
        oy -= w->y();
        ignoreUpTo = w;
        w = w->parentWidget();
        r &= QRegion(ox, oy, w->width(), w->height());

        int i = 0;
        while(w->d_func()->children.at(i++) != static_cast<const QObject *>(ignoreUpTo))
            ;
        for ( ; i < w->d_func()->children.size(); ++i) {
            if (QWidget *sibling = qobject_cast<QWidget *>(w->d_func()->children.at(i))) {
                if (sibling->isVisible() && !sibling->isWindow()) {
                    QRect siblingRect(ox+sibling->x(), oy+sibling->y(),
                                      sibling->width(), sibling->height());
                    if (qRectIntersects(siblingRect, q->rect()))
                        r -= QRegion(siblingRect);
                }
            }
        }
    }
    return r;
}